

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

N_Vector N_VNewEmpty_SensWrapper(int nvecs,SUNContext_conflict sunctx)

{
  long *__ptr;
  void *pvVar1;
  int in_EDI;
  N_VectorContent_SensWrapper content;
  N_Vector v;
  int i;
  int local_1c;
  N_Vector local_8;
  
  if (in_EDI < 1) {
    local_8 = (N_Vector)0x0;
  }
  else {
    local_8 = N_VNewEmpty((SUNContext_conflict)0x0);
    if (local_8 == (N_Vector)0x0) {
      local_8 = (N_Vector)0x0;
    }
    else {
      local_8->ops->nvclone = N_VClone_SensWrapper;
      local_8->ops->nvcloneempty = N_VCloneEmpty_SensWrapper;
      local_8->ops->nvdestroy = N_VDestroy_SensWrapper;
      local_8->ops->nvlinearsum = N_VLinearSum_SensWrapper;
      local_8->ops->nvconst = N_VConst_SensWrapper;
      local_8->ops->nvprod = N_VProd_SensWrapper;
      local_8->ops->nvdiv = N_VDiv_SensWrapper;
      local_8->ops->nvscale = N_VScale_SensWrapper;
      local_8->ops->nvabs = N_VAbs_SensWrapper;
      local_8->ops->nvinv = N_VInv_SensWrapper;
      local_8->ops->nvaddconst = N_VAddConst_SensWrapper;
      local_8->ops->nvdotprod = N_VDotProd_SensWrapper;
      local_8->ops->nvmaxnorm = N_VMaxNorm_SensWrapper;
      local_8->ops->nvwrmsnormmask = N_VWrmsNormMask_SensWrapper;
      local_8->ops->nvwrmsnorm = N_VWrmsNorm_SensWrapper;
      local_8->ops->nvmin = N_VMin_SensWrapper;
      local_8->ops->nvwl2norm = N_VWL2Norm_SensWrapper;
      local_8->ops->nvl1norm = N_VL1Norm_SensWrapper;
      local_8->ops->nvcompare = N_VCompare_SensWrapper;
      local_8->ops->nvinvtest = N_VInvTest_SensWrapper;
      local_8->ops->nvconstrmask = N_VConstrMask_SensWrapper;
      local_8->ops->nvminquotient = N_VMinQuotient_SensWrapper;
      __ptr = (long *)malloc(0x10);
      if (__ptr == (long *)0x0) {
        N_VFreeEmpty((N_Vector)0x11482c);
        local_8 = (N_Vector)0x0;
      }
      else {
        *(int *)(__ptr + 1) = in_EDI;
        *(undefined4 *)((long)__ptr + 0xc) = 0;
        *__ptr = 0;
        pvVar1 = malloc((long)in_EDI << 3);
        *__ptr = (long)pvVar1;
        if (*__ptr == 0) {
          free(__ptr);
          N_VFreeEmpty((N_Vector)0x114896);
          local_8 = (N_Vector)0x0;
        }
        else {
          for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
            *(undefined8 *)(*__ptr + (long)local_1c * 8) = 0;
          }
          local_8->content = __ptr;
        }
      }
    }
  }
  return local_8;
}

Assistant:

N_Vector N_VNewEmpty_SensWrapper(int nvecs, SUNContext sunctx)
{
  int i;
  N_Vector v;
  N_VectorContent_SensWrapper content;

  /* return if wrapper is empty */
  if (nvecs < 1) { return (NULL); }

  /* Create an empty vector object */
  v = NULL;
  v = N_VNewEmpty(sunctx);
  if (v == NULL) { return (NULL); }

  /* Attach operations */

  v->ops->nvclone      = N_VClone_SensWrapper;
  v->ops->nvcloneempty = N_VCloneEmpty_SensWrapper;
  v->ops->nvdestroy    = N_VDestroy_SensWrapper;

  /* standard vector operations */
  v->ops->nvlinearsum    = N_VLinearSum_SensWrapper;
  v->ops->nvconst        = N_VConst_SensWrapper;
  v->ops->nvprod         = N_VProd_SensWrapper;
  v->ops->nvdiv          = N_VDiv_SensWrapper;
  v->ops->nvscale        = N_VScale_SensWrapper;
  v->ops->nvabs          = N_VAbs_SensWrapper;
  v->ops->nvinv          = N_VInv_SensWrapper;
  v->ops->nvaddconst     = N_VAddConst_SensWrapper;
  v->ops->nvdotprod      = N_VDotProd_SensWrapper;
  v->ops->nvmaxnorm      = N_VMaxNorm_SensWrapper;
  v->ops->nvwrmsnormmask = N_VWrmsNormMask_SensWrapper;
  v->ops->nvwrmsnorm     = N_VWrmsNorm_SensWrapper;
  v->ops->nvmin          = N_VMin_SensWrapper;
  v->ops->nvwl2norm      = N_VWL2Norm_SensWrapper;
  v->ops->nvl1norm       = N_VL1Norm_SensWrapper;
  v->ops->nvcompare      = N_VCompare_SensWrapper;
  v->ops->nvinvtest      = N_VInvTest_SensWrapper;
  v->ops->nvconstrmask   = N_VConstrMask_SensWrapper;
  v->ops->nvminquotient  = N_VMinQuotient_SensWrapper;

  /* create content */
  content = NULL;
  content = (N_VectorContent_SensWrapper)malloc(sizeof *content);
  if (content == NULL)
  {
    N_VFreeEmpty(v);
    return (NULL);
  }

  content->nvecs    = nvecs;
  content->own_vecs = SUNFALSE;
  content->vecs     = NULL;
  content->vecs     = (N_Vector*)malloc(nvecs * sizeof(N_Vector));
  if (content->vecs == NULL)
  {
    free(content);
    N_VFreeEmpty(v);
    return (NULL);
  }

  /* initialize vector array to null */
  for (i = 0; i < nvecs; i++) { content->vecs[i] = NULL; }

  /* attach content */
  v->content = content;

  return (v);
}